

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpSendAdvertisementLowPower
              (UpnpDevice_Handle Hnd,int Exp,int PowerState,int SleepPeriod,int RegistrationState)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  uint *__ptr;
  job_arg *arg;
  UpnpDevice_Handle line;
  Handle_Info **ppHVar3;
  uint Exp_00;
  uint uVar4;
  Handle_Info *SInfo;
  ThreadPoolJob job;
  
  SInfo = (Handle_Info *)0x0;
  job.requestTime.tv_usec = 0;
  job.priority = LOW_PRIORITY;
  job.jobId = 0;
  job.free_func = (free_routine)0x0;
  job.requestTime.tv_sec = 0;
  job.func = (start_routine)0x0;
  job.arg = (void *)0x0;
  if (UpnpSdkInit != 1) {
    return -0x74;
  }
  iVar2 = 6;
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x79d,"Inside UpnpSendAdvertisementLowPower \n")
  ;
  HandleLock((char *)0x7a0,iVar2);
  ppHVar3 = &SInfo;
  UVar1 = GetHandleInfo(Hnd,ppHVar3);
  if (UVar1 == HND_DEVICE) {
    uVar4 = 0x708;
    if (0 < Exp) {
      uVar4 = Exp;
    }
    Exp_00 = 0x3e;
    if (0x3c < uVar4) {
      Exp_00 = uVar4;
    }
    SInfo->MaxAge = Exp_00;
    SInfo->PowerState = PowerState;
    iVar2 = -1;
    if (-1 < SleepPeriod) {
      iVar2 = SleepPeriod;
    }
    SInfo->SleepPeriod = iVar2;
    SInfo->RegistrationState = RegistrationState;
    HandleUnlock((char *)0x7b2,(int)ppHVar3);
    line = Hnd;
    iVar2 = AdvertiseAndReply(1,Hnd,SSDP_ALL,(sockaddr *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                              Exp_00);
    if (iVar2 != 0) {
      return iVar2;
    }
    __ptr = (uint *)malloc(4);
    if (__ptr == (uint *)0x0) {
      return -0x68;
    }
    arg = (job_arg *)malloc(0x760);
    if (arg == (job_arg *)0x0) {
      free(__ptr);
      return -0x68;
    }
    *__ptr = Exp_00;
    (arg->advertise).handle = Hnd;
    (arg->advertise).Event = __ptr;
    HandleLock((char *)0x7cb,line);
    ppHVar3 = &SInfo;
    UVar1 = GetHandleInfo(Hnd,ppHVar3);
    if (UVar1 == HND_DEVICE) {
      TPJobInit(&job,AutoAdvertise,arg);
      TPJobSetFreeFunction(&job,free_advertise_arg);
      TPJobSetPriority(&job,MED_PRIORITY);
      uVar4 = (Exp_00 >> 1) - 0x1e;
      iVar2 = TimerThreadSchedule(&gTimerThread,(ulong)uVar4,REL_SEC,&job,SHORT_TERM,
                                  &(arg->advertise).eventId);
      if (iVar2 != 0) {
        HandleUnlock((char *)0x7df,uVar4);
        free_advertise_arg(arg);
        return iVar2;
      }
      HandleUnlock((char *)0x7f3,uVar4);
      UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x7f7,
                 "Exiting UpnpSendAdvertisementLowPower \n");
      return 0;
    }
    HandleUnlock((char *)0x7d0,(int)ppHVar3);
    free(arg);
    free(__ptr);
  }
  else {
    HandleUnlock((char *)0x7a5,(int)ppHVar3);
  }
  return -100;
}

Assistant:

int UpnpSendAdvertisementLowPower(UpnpDevice_Handle Hnd,
	int Exp,
	int PowerState,
	int SleepPeriod,
	int RegistrationState)
{
	struct Handle_Info *SInfo = NULL;
	int retVal = 0, *ptrMx;
	job_arg *adEvent;
	ThreadPoolJob job;

	memset(&job, 0, sizeof(job));

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpSendAdvertisementLowPower \n");

	HandleLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}
	if (Exp < 1)
		Exp = DEFAULT_MAXAGE;
	if (Exp <= AUTO_ADVERTISEMENT_TIME * 2)
		Exp = (AUTO_ADVERTISEMENT_TIME + 1) * 2;
	SInfo->MaxAge = Exp;
	SInfo->PowerState = PowerState;
	if (SleepPeriod < 0)
		SleepPeriod = -1;
	SInfo->SleepPeriod = SleepPeriod;
	SInfo->RegistrationState = RegistrationState;
	HandleUnlock(__FILE__, __LINE__);
	retVal = AdvertiseAndReply(1,
		Hnd,
		(enum SsdpSearchType)0,
		(struct sockaddr *)NULL,
		(char *)NULL,
		(char *)NULL,
		(char *)NULL,
		Exp);

	if (retVal != UPNP_E_SUCCESS)
		return retVal;
	ptrMx = (int *)malloc(sizeof(int));
	if (ptrMx == NULL)
		return UPNP_E_OUTOF_MEMORY;
	adEvent = (job_arg *)malloc(sizeof(job_arg));

	if (adEvent == NULL) {
		free(ptrMx);
		return UPNP_E_OUTOF_MEMORY;
	}
	*ptrMx = Exp;
	adEvent->advertise.handle = Hnd;
	adEvent->advertise.Event = ptrMx;

	HandleLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_DEVICE:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		free(adEvent);
		free(ptrMx);
		return UPNP_E_INVALID_HANDLE;
	}
		#ifdef SSDP_PACKET_DISTRIBUTE
	TPJobInit(&job, (start_routine)AutoAdvertise, adEvent);
	TPJobSetFreeFunction(&job, (free_routine)free_advertise_arg);
	TPJobSetPriority(&job, MED_PRIORITY);
	if ((retVal = TimerThreadSchedule(&gTimerThread,
		     ((Exp / 2) - (AUTO_ADVERTISEMENT_TIME)),
		     REL_SEC,
		     &job,
		     SHORT_TERM,
		     &(adEvent->advertise.eventId))) != UPNP_E_SUCCESS) {
		HandleUnlock(__FILE__, __LINE__);
		free_advertise_arg(adEvent);
		return retVal;
	}
		#else
	TPJobInit(&job, (start_routine)AutoAdvertise, adEvent);
	TPJobSetFreeFunction(&job, (free_routine)free_advertise_arg);
	TPJobSetPriority(&job, MED_PRIORITY);
	if ((retVal = TimerThreadSchedule(&gTimerThread,
		     Exp - AUTO_ADVERTISEMENT_TIME,
		     REL_SEC,
		     &job,
		     SHORT_TERM,
		     &(adEvent->advertise.eventId))) != UPNP_E_SUCCESS) {
		HandleUnlock(__FILE__, __LINE__);
		free_advertise_arg(adEvent);
		return retVal;
	}
		#endif

	HandleUnlock(__FILE__, __LINE__);
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSendAdvertisementLowPower \n");

	return retVal;
}